

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderSwitchTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::ShaderSwitchTests::makeSwitchCases
          (ShaderSwitchTests *this,string *name,string *desc,LineStream *switchBody)

{
  TestContext *pTVar1;
  TestNode *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderSwitchCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderSwitchCase>_>
  local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderSwitchCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderSwitchCase>_>
  local_40;
  SwitchType local_2c;
  LineStream *pLStack_28;
  int type;
  LineStream *switchBody_local;
  string *desc_local;
  string *name_local;
  ShaderSwitchTests *this_local;
  
  pLStack_28 = switchBody;
  switchBody_local = (LineStream *)desc;
  desc_local = name;
  name_local = (string *)this;
  for (local_2c = SWITCHTYPE_STATIC; (int)local_2c < 3; local_2c = local_2c + SWITCHTYPE_UNIFORM) {
    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
    std::operator+(&local_a0,desc_local,"_");
    std::operator+(&local_80,&local_a0,makeSwitchCases::switchTypeNames[(int)local_2c]);
    std::operator+(&local_60,&local_80,"_vertex");
    makeSwitchCase(&local_40,pTVar1,&local_60,(string *)switchBody_local,local_2c,true,pLStack_28);
    pTVar2 = (TestNode *)
             de::details::
             MovePtr<vkt::sr::(anonymous_namespace)::ShaderSwitchCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderSwitchCase>_>
             ::release(&local_40);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    de::details::
    MovePtr<vkt::sr::(anonymous_namespace)::ShaderSwitchCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderSwitchCase>_>
    ::~MovePtr(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
    std::operator+(&local_120,desc_local,"_");
    std::operator+(&local_100,&local_120,makeSwitchCases::switchTypeNames[(int)local_2c]);
    std::operator+(&local_e0,&local_100,"_fragment");
    makeSwitchCase(local_c0,pTVar1,&local_e0,(string *)switchBody_local,local_2c,false,pLStack_28);
    pTVar2 = (TestNode *)
             de::details::
             MovePtr<vkt::sr::(anonymous_namespace)::ShaderSwitchCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderSwitchCase>_>
             ::release(local_c0);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    de::details::
    MovePtr<vkt::sr::(anonymous_namespace)::ShaderSwitchCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderSwitchCase>_>
    ::~MovePtr(local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  return;
}

Assistant:

void ShaderSwitchTests::makeSwitchCases (const string& name, const string& desc, const LineStream& switchBody)
{
	static const char* switchTypeNames[] = { "static", "uniform", "dynamic" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(switchTypeNames) == SWITCHTYPE_LAST);

	for (int type = 0; type < SWITCHTYPE_LAST; type++)
	{
		addChild(makeSwitchCase(m_testCtx, (name + "_" + switchTypeNames[type] + "_vertex"),	desc, (SwitchType)type, true,	switchBody).release());
		addChild(makeSwitchCase(m_testCtx, (name + "_" + switchTypeNames[type] + "_fragment"),	desc, (SwitchType)type, false,	switchBody).release());
	}
}